

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  int iVar1;
  undefined4 local_38 [2];
  size_t dlen;
  int rc;
  uint src_len_local;
  char *src_local;
  uint *datalen_local;
  char **data_local;
  LIBSSH2_SESSION *session_local;
  
  dlen._4_4_ = src_len;
  _rc = src;
  src_local = (char *)datalen;
  datalen_local = (uint *)data;
  data_local = (char **)session;
  iVar1 = _libssh2_base64_decode(session,data,(size_t *)local_38,src,(ulong)src_len);
  if (src_local != (char *)0x0) {
    *(undefined4 *)src_local = local_38[0];
  }
  return iVar1;
}

Assistant:

int _libssh2_base64_decode(LIBSSH2_SESSION *session,
                           char **data, size_t *datalen,
                           const char *src, size_t src_len)
{
    unsigned char *d;
    const char *s;
    short v;
    ssize_t i = 0, len = 0;

    *data = LIBSSH2_ALLOC(session, ((src_len / 4) * 3) + 1);
    d = (unsigned char *) *data;
    if(!d) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for base64 decoding");
    }

    for(s = src; s < (src + src_len); s++) {
        v = base64_reverse_table[(unsigned char)*s];
        if(v < 0)
            continue;
        switch(i % 4) {
        case 0:
            d[len] = (unsigned char)(v << 2);
            break;
        case 1:
            d[len++] |= (unsigned char)(v >> 4);
            d[len] = (unsigned char)(v << 4);
            break;
        case 2:
            d[len++] |= (unsigned char)(v >> 2);
            d[len] = (unsigned char)(v << 6);
            break;
        case 3:
            d[len++] |= (unsigned char)v;
            break;
        }
        i++;
    }
    if((i % 4) == 1) {
        /* Invalid -- We have a byte which belongs exclusively to a partial
           octet */
        LIBSSH2_FREE(session, *data);
        *data = NULL;
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL, "Invalid base64");
    }

    *datalen = len;
    return 0;
}